

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::extract_global_variables_from_function
          (CompilerMSL *this,uint32_t func_id,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *added_arg_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *global_var_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *processed_func_ids)

{
  _Rb_tree_const_iterator<unsigned_int> __last;
  char cVar1;
  ushort uVar2;
  size_t sVar3;
  Decoration *pDVar4;
  Parameter *pPVar5;
  undefined8 uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  BuiltIn BVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  TypeID TVar18;
  __node_base_ptr p_Var19;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var20;
  TypedID<(spirv_cross::Types)1> *pTVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  uint32_t uVar25;
  StorageClass SVar26;
  ID id;
  ExecutionModel EVar27;
  iterator iVar28;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *p_Var29;
  uint32_t *puVar30;
  _Node_iterator_base<unsigned_int,_false> _Var31;
  SPIRExtension *pSVar32;
  const_iterator cVar33;
  SPIRType *type;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar38;
  SPIRType *pSVar34;
  mapped_type *pmVar35;
  mapped_type *pmVar36;
  SPIRVariable *pSVar37;
  CompilerError *this_00;
  byte bVar39;
  long lVar40;
  char *pcVar41;
  byte bVar42;
  Instruction *instr;
  _Base_ptr p_Var43;
  uint32_t *puVar44;
  uint32_t *puVar45;
  uint uVar46;
  SPIRBlock *pSVar47;
  ID *pIVar48;
  uint32_t *puVar49;
  _Rb_tree_header *p_Var50;
  ulong uVar51;
  byte bVar52;
  uint32_t rvalue_id;
  uint32_t type_id;
  uint32_t ptr_type_id;
  __node_gen_type __node_gen;
  ID local_110;
  TypeID local_10c;
  SPIRVariable *local_108;
  uint32_t *local_100;
  key_type local_f4;
  SPIRType *local_f0;
  SPIRBlock *local_e8;
  key_type local_dc;
  uint32_t *local_d8;
  undefined1 local_d0 [16];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  local_c0;
  ParsedIR *local_88;
  SPIRType *local_80;
  _Base_ptr local_78;
  uint32_t *local_70;
  uint32_t *local_68;
  key_type local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_40;
  TypedID<(spirv_cross::Types)1> *local_38;
  
  bVar52 = 0;
  local_c0._M_h._M_rehash_policy._4_4_ = func_id;
  iVar28 = ::std::
           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::find(&processed_func_ids->_M_h,
                  (key_type_conflict *)&local_c0._M_h._M_rehash_policy.field_0x4);
  if (iVar28.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    local_d0._0_8_ = processed_func_ids;
    local_88 = (ParsedIR *)processed_func_ids;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)processed_func_ids,&local_c0._M_h._M_rehash_policy.field_0x4);
    local_c0._M_h._M_single_bucket =
         (__node_base_ptr)
         Variant::get<spirv_cross::SPIRFunction>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr +
                    (uint)local_c0._M_h._M_rehash_policy._4_4_);
    sVar3 = (((SPIRFunction *)local_c0._M_h._M_single_bucket)->blocks).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.buffer_size;
    if (sVar3 != 0) {
      pSVar34 = (SPIRType *)
                (((SPIRFunction *)local_c0._M_h._M_single_bucket)->blocks).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr;
      local_80 = (SPIRType *)((pSVar34->array).stack_storage.aligned_char + sVar3 * 4 + -0x38);
      local_100 = &this->builtin_helper_invocation_id;
      local_d8 = &this->builtin_subgroup_invocation_id_id;
      local_78 = (_Base_ptr)&this->builtin_subgroup_size_id;
      local_58 = &(this->atomic_image_vars_emulated)._M_h;
      local_c0._M_h._M_rehash_policy._M_next_resize = (size_t)&this->builtin_frag_coord_id;
      local_70 = &this->builtin_layer_id;
      local_68 = &this->builtin_view_idx_id;
      do {
        local_f0 = pSVar34;
        local_e8 = Variant::get<spirv_cross::SPIRBlock>
                             ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr +
                              *(uint *)&(pSVar34->super_IVariant)._vptr_IVariant);
        sVar3 = (local_e8->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
        if (sVar3 != 0) {
          instr = (local_e8->ops).super_VectorView<spirv_cross::Instruction>.ptr;
          local_108 = (SPIRVariable *)(instr + sVar3);
          do {
            puVar30 = Compiler::stream((Compiler *)this,instr);
            uVar2 = instr->op;
            uVar46 = (uint)uVar2;
            if (uVar2 < 0x157) {
              if (uVar2 < 0xe4) {
                if (uVar2 < 99) {
                  switch(uVar2) {
                  case 0x39:
                    if (3 < instr->length) {
                      uVar51 = 3;
                      do {
                        local_d0._0_4_ = puVar30[uVar51];
                        iVar28 = ::std::
                                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 ::find(&global_var_ids->_M_h,(key_type_conflict *)local_d0);
                        if (iVar28.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                            (__node_type *)0x0) {
                          ::std::
                          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          ::_M_insert_unique<unsigned_int_const&>
                                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                      *)added_arg_ids,(uint *)local_d0);
                        }
                        uVar51 = uVar51 + 1;
                      } while (uVar51 < instr->length);
                    }
                    local_d0._8_8_ = local_d0._8_8_ & 0xffffffff00000000;
                    local_c0._M_h._M_buckets = (__buckets_ptr)0x0;
                    __last._M_node = (_Base_ptr)(local_d0 + 8);
                    local_c0._M_h._M_element_count = 0;
                    local_c0._M_h._M_bucket_count = (size_type)__last._M_node;
                    local_c0._M_h._M_before_begin._M_nxt = (_Hash_node_base *)__last._M_node;
                    extract_global_variables_from_function
                              (this,puVar30[2],
                               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)local_d0,global_var_ids,
                               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)local_88);
                    ::std::
                    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<unsigned_int>>
                              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)added_arg_ids,
                               (_Rb_tree_const_iterator<unsigned_int>)local_c0._M_h._M_bucket_count,
                               __last);
                    ::std::
                    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)local_d0);
                    break;
                  case 0x3a:
                  case 0x3b:
                  case 0x3f:
                  case 0x40:
                    break;
                  case 0x3c:
                    local_d0._0_4_ = puVar30[2];
                    pSVar37 = Compiler::maybe_get_backing_variable((Compiler *)this,puVar30[2]);
                    if (pSVar37 != (SPIRVariable *)0x0) {
                      local_110.id = (pSVar37->super_IVariant).self.id;
                      cVar33 = ::std::
                               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               ::find(local_58,&local_110.id);
                      if ((cVar33.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                           (__node_type *)0x0) &&
                         (pSVar34 = Variant::get<spirv_cross::SPIRType>
                                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                               super_VectorView<spirv_cross::Variant>.ptr +
                                               *(uint *)&(pSVar37->super_IVariant).field_0xc),
                         (pSVar34->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
                        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
                        CompilerError::CompilerError
                                  (this_00,
                                   "Cannot emulate array of storage images with atomics. Use MSL 3.1 for native support."
                                  );
                        __cxa_throw(this_00,&CompilerError::typeinfo,
                                    ::std::runtime_error::~runtime_error);
                      }
LAB_0027e308:
                      _Var31._M_cur =
                           (__node_type *)
                           ::std::
                           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::find(&global_var_ids->_M_h,(key_type_conflict *)local_d0);
                      goto joined_r0x0027e316;
                    }
                    break;
                  case 0x3d:
                  case 0x41:
                  case 0x42:
                  case 0x43:
                  case 0x44:
                    local_d0._0_4_ = puVar30[2];
                    iVar28 = ::std::
                             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::find(&global_var_ids->_M_h,(key_type_conflict *)local_d0);
                    if (iVar28.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                        (__node_type *)0x0) {
                      ::std::
                      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      ::_M_insert_unique<unsigned_int_const&>
                                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                  *)added_arg_ids,(uint *)local_d0);
                    }
                    pSVar34 = Variant::get<spirv_cross::SPIRType>
                                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                         super_VectorView<spirv_cross::Variant>.ptr + *puVar30);
                    if (((pSVar34->basetype == Image) && ((pSVar34->image).dim == DimSubpassData))
                       && ((this->msl_options).use_framebuffer_fetch_subpasses == false)) {
                      if (*(uint32_t *)local_c0._M_h._M_rehash_policy._M_next_resize == 0) {
                        __assert_fail("builtin_frag_coord_id != 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                                      ,0x750,
                                      "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                                     );
                      }
                      ::std::
                      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      ::_M_insert_unique<unsigned_int_const&>
                                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                  *)added_arg_ids,
                                 (uint *)local_c0._M_h._M_rehash_policy._M_next_resize);
                      if ((this->msl_options).multiview == true) {
                        p_Var43 = (_Base_ptr)local_68;
                        if (*local_68 == 0) {
                          __assert_fail("builtin_view_idx_id != 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                                        ,0x755,
                                        "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                                       );
                        }
                      }
                      else {
                        if ((this->msl_options).arrayed_subpass_input != true) break;
                        p_Var43 = (_Base_ptr)local_70;
                        if (*local_70 == 0) {
                          __assert_fail("builtin_layer_id != 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                                        ,0x75b,
                                        "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                                       );
                        }
                      }
LAB_0027e04b:
                      ::std::
                      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      ::_M_insert_unique<unsigned_int_const&>
                                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                  *)added_arg_ids,&p_Var43->_M_color);
                    }
                    break;
                  case 0x3e:
                    local_d0._0_4_ = *puVar30;
                    iVar28 = ::std::
                             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::find(&global_var_ids->_M_h,(key_type_conflict *)local_d0);
                    if (((iVar28.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                          (__node_type *)0x0) &&
                        (::std::
                         _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                         ::_M_insert_unique<unsigned_int_const&>
                                   ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                     *)added_arg_ids,(uint *)local_d0),
                        (this->msl_options).input_attachment_is_ds_attachment == true)) &&
                       (local_d0._0_4_ == this->builtin_frag_depth_id)) {
                      this->writes_to_depth = true;
                    }
                    local_110.id = puVar30[1];
                    iVar28 = ::std::
                             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::find(&global_var_ids->_M_h,&local_110.id);
                    if (iVar28.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                        (__node_type *)0x0) {
                      ::std::
                      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      ::_M_insert_unique<unsigned_int_const&>
                                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                  *)added_arg_ids,&local_110.id);
                    }
                    EVar27 = Compiler::get_execution_model((Compiler *)this);
                    if (((EVar27 == ExecutionModelFragment) &&
                        (0x4f4b < (this->msl_options).msl_version)) &&
                       ((this->msl_options).check_discarded_frag_stores == true)) {
                      cVar1 = this->frag_shader_needs_discard_checks;
                      p_Var43 = (_Base_ptr)local_100;
                      goto joined_r0x0027e2a0;
                    }
                    break;
                  default:
                    if ((uVar2 == 0xc) &&
                       (pSVar32 = Variant::get<spirv_cross::SPIRExtension>
                                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                             super_VectorView<spirv_cross::Variant>.ptr + puVar30[2]
                                            ), *(int *)&(pSVar32->super_IVariant).field_0xc == 1)) {
                      uVar25 = puVar30[3];
                      if (uVar25 - 0x4c < 3) {
                        local_d0._0_4_ = (this->stage_in_var_id).id;
                        ::std::
                        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                        ::_M_insert_unique<unsigned_int>(&added_arg_ids->_M_t,(uint *)local_d0);
                      }
                      else if ((uVar25 == 0x23) || (uVar25 == 0x33)) {
                        uVar25 = puVar30[5];
                        goto LAB_0027e02b;
                      }
                    }
                  }
                }
                else {
                  if (uVar2 == 99) goto LAB_0027def0;
                  if (uVar2 == 0xa9) {
                    local_d0._0_4_ = puVar30[3];
                    iVar28 = ::std::
                             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::find(&global_var_ids->_M_h,(key_type_conflict *)local_d0);
                    if (iVar28.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                        (__node_type *)0x0) {
                      ::std::
                      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      ::_M_insert_unique<unsigned_int_const&>
                                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                  *)added_arg_ids,(uint *)local_d0);
                    }
                    local_d0._0_4_ = puVar30[4];
                    goto LAB_0027e308;
                  }
                }
              }
              else {
                if ((uVar2 - 0xe4 < 0xf) && (uVar2 - 0xe4 != 3)) {
LAB_0027def0:
                  EVar27 = Compiler::get_execution_model((Compiler *)this);
                  if (((EVar27 == ExecutionModelFragment) &&
                      (0x4f4b < (this->msl_options).msl_version)) &&
                     (((this->msl_options).check_discarded_frag_stores == true &&
                      (this->frag_shader_needs_discard_checks == true)))) {
                    ::std::
                    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    ::_M_insert_unique<unsigned_int_const&>
                              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)added_arg_ids,local_100);
                  }
                  local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
                  if ((uVar46 != 99) && (uVar2 != 0xe4)) {
                    puVar30 = puVar30 + 2;
                  }
LAB_0027e029:
                  uVar25 = *puVar30;
                  goto LAB_0027e02b;
                }
                p_Var43 = (_Base_ptr)local_d8;
                if ((uVar2 == 0x154) ||
                   ((uVar2 == 0x156 &&
                    ((puVar30[3] - 1 < 2 || (p_Var43 = local_78, puVar30[3] == 0))))))
                goto LAB_0027e04b;
              }
            }
            else {
              p_Var43 = (_Base_ptr)local_100;
              if (uVar2 < 0x1505) {
                if (uVar2 < 0x117f) {
                  if (uVar2 - 0x1179 < 5) goto LAB_0027e029;
                  p_Var43 = local_78;
                  if (uVar46 - 0x157 < 2) goto LAB_0027e04b;
                }
                else {
                  if (uVar2 == 0x117f) goto LAB_0027dec5;
                  if (((uVar2 == 0x1504) &&
                      ((this->msl_options).manual_helper_invocation_updates == true)) &&
                     (0x4f4b < (this->msl_options).msl_version)) {
                    cVar1 = this->needs_helper_invocation;
joined_r0x0027e2a0:
                    local_100 = &p_Var43->_M_color;
                    if (cVar1 == '\x01') goto LAB_0027e04b;
                  }
                }
              }
              else if (uVar2 - 0x1780 < 0x11) {
LAB_0027dec5:
                uVar25 = puVar30[2];
LAB_0027e02b:
                local_d0._0_4_ = uVar25;
                _Var31._M_cur =
                     (__node_type *)
                     ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find(&global_var_ids->_M_h,(key_type_conflict *)local_d0);
joined_r0x0027e316:
                p_Var43 = (_Base_ptr)local_d0;
                if (_Var31._M_cur != (__node_type *)0x0) goto LAB_0027e04b;
              }
              else if (uVar46 == 0x1505) {
                if (((this->msl_options).manual_helper_invocation_updates == true) &&
                   (0x4f4b < (this->msl_options).msl_version)) goto LAB_0027e04b;
              }
              else if (uVar46 == 0x1793) goto LAB_0027def0;
            }
            if (((((this->msl_options).manual_helper_invocation_updates == true) &&
                 (0x4f4b < (this->msl_options).msl_version)) &&
                (*(int *)&(local_e8->super_IVariant).field_0xc == 6)) &&
               (this->needs_helper_invocation == true)) {
              ::std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)added_arg_ids,local_100);
            }
            instr = instr + 1;
          } while ((SPIRVariable *)instr != local_108);
        }
        pSVar34 = (SPIRType *)((long)&(local_f0->super_IVariant)._vptr_IVariant + 4);
      } while (pSVar34 != local_80);
    }
    p_Var29 = &::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->function_global_vars,
                            (key_type *)&local_c0._M_h._M_rehash_policy.field_0x4)->_M_t;
    ::std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(p_Var29,&added_arg_ids->_M_t);
    if (local_c0._M_h._M_rehash_policy._4_4_ !=
        (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
      local_78 = (added_arg_ids->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var50 = &(added_arg_ids->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)local_78 != p_Var50) {
        local_88 = &(this->super_CompilerGLSL).super_Compiler.ir;
        local_c0._M_h._M_rehash_policy._M_next_resize = (long)local_c0._M_h._M_single_bucket + 0x18;
        local_40 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
        local_d8 = (uint32_t *)0x0;
        puVar30 = (uint32_t *)0x0;
        pSVar47 = (SPIRBlock *)0x0;
        pSVar34 = (SPIRType *)0x0;
        do {
          local_110.id = local_78[1]._M_color;
          local_100 = puVar30;
          local_e8 = pSVar47;
          local_108 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + local_110.id);
          local_10c.id = *(uint32_t *)&(local_108->super_IVariant).field_0xc;
          type = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr + local_10c.id);
          uVar25 = Compiler::get_decoration((Compiler *)this,local_110,BuiltIn);
          bVar22 = Compiler::has_decoration((Compiler *)this,local_110,DecorationPatch);
          local_80 = pSVar34;
          if (bVar22) {
            bVar23 = Compiler::has_decoration
                               ((Compiler *)this,(ID)(type->super_IVariant).self.id,Block);
            uVar38 = extraout_var;
LAB_0027e5a2:
            if (bVar23 == false) {
              local_f0 = (SPIRType *)CONCAT44(local_f0._4_4_,(int)CONCAT71(uVar38,1));
              bVar22 = false;
            }
            else {
              bVar22 = local_108->storage == Output;
              local_f0 = (SPIRType *)CONCAT44(local_f0._4_4_,(int)CONCAT71(uVar38,1));
            }
          }
          else {
            bVar22 = is_patch_block(this,type);
            bVar23 = Compiler::has_decoration
                               ((Compiler *)this,(ID)(type->super_IVariant).self.id,Block);
            uVar38 = extraout_var_00;
            if (bVar22) goto LAB_0027e5a2;
            bVar22 = Compiler::is_tessellation_shader((Compiler *)this);
            if ((bVar22) && (local_108->storage == Input)) {
              bVar22 = true;
LAB_0027e609:
              local_f0 = (SPIRType *)((ulong)local_f0 & 0xffffffff00000000);
            }
            else {
              EVar27 = Compiler::get_execution_model((Compiler *)this);
              if (EVar27 != ExecutionModelTessellationControl) {
                bVar22 = false;
                goto LAB_0027e609;
              }
              bVar22 = local_108->storage == Output;
              local_f0 = (SPIRType *)((ulong)local_f0 & 0xffffffff00000000);
            }
          }
          pIVar48 = &(type->super_IVariant).self;
          bVar24 = Compiler::is_builtin_variable((Compiler *)this,local_108);
          pSVar37 = local_108;
          bVar23 = true;
          if ((bVar24) && ((4 < uVar25 || ((0x1bU >> (uVar25 & 0x1f) & 1) == 0)))) {
            bVar23 = type->basetype == Struct;
          }
          if (((bool)(bVar22 & bVar23)) && (local_108->storage == Output)) {
            bVar22 = CompilerGLSL::is_stage_output_variable_masked
                               (&this->super_CompilerGLSL,local_108);
            if (!bVar22) goto LAB_0027e665;
LAB_0027e6be:
            if ((bVar24) &&
               (bVar22 = Compiler::has_decoration((Compiler *)this,(ID)pIVar48->id,Block), bVar22))
            {
              local_10c.id = Compiler::get_pointee_type_id((Compiler *)this,local_10c.id);
              pSVar34 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr + local_10c.id);
              sVar3 = (pSVar34->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
              puVar30 = local_100;
              pSVar47 = local_e8;
              if (sVar3 != 0) {
                local_38 = (pSVar34->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
                puVar49 = (uint32_t *)(sVar3 << 2);
                uVar51 = 0;
                local_f0 = pSVar34;
                do {
                  local_d0._0_4_ = 0x7fffffff;
                  bVar22 = Compiler::is_member_builtin
                                     ((Compiler *)this,local_f0,(uint32_t)uVar51,(BuiltIn *)local_d0
                                     );
                  if (bVar22) {
                    bVar22 = Compiler::has_active_builtin
                                       ((Compiler *)this,local_d0._0_4_,pSVar37->storage);
                    if (bVar22) {
                      local_68 = puVar49;
                      uVar25 = ParsedIR::increase_bound_by(local_88,2);
                      pTVar21 = local_38;
                      local_58 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  *)CONCAT44(local_58._4_4_,uVar25 + 1);
                      local_f4.id = uVar25;
                      pSVar34 = Variant::get<spirv_cross::SPIRType>
                                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                           super_VectorView<spirv_cross::Variant>.ptr +
                                           local_38[uVar51].id);
                      pSVar34 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                                          ((Compiler *)this,uVar25,pSVar34);
                      p_Var19 = local_c0._M_h._M_single_bucket;
                      (pSVar34->super_IVariant).self.id = pTVar21[uVar51].id;
                      pSVar34->storage = pSVar37->storage;
                      pSVar34->pointer = true;
                      pSVar34->pointer_depth = pSVar34->pointer_depth + 1;
                      uVar25 = pTVar21[uVar51].id;
                      (pSVar34->parent_type).id = uVar25;
                      SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                                ((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                                 local_c0._M_h._M_rehash_policy._M_next_resize,
                                 (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                                  ((long)local_c0._M_h._M_single_bucket + 0x18))->
                                 super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size
                                 + 1);
                      pPVar5 = (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                                ((long)p_Var19 + 0x18))->
                               super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr;
                      sVar3 = (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                               ((long)p_Var19 + 0x18))->
                              super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size;
                      pPVar5[sVar3].type.id = uVar25;
                      uVar25 = (uint32_t)local_58;
                      pPVar5[sVar3].id.id = (uint32_t)local_58;
                      pPVar5[sVar3].read_count = 0;
                      pPVar5[sVar3].write_count = 0;
                      pPVar5[sVar3].alias_global_variable = true;
                      (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                       ((long)p_Var19 + 0x18))->
                      super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size =
                           sVar3 + 1;
                      local_dc.id = 7;
                      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                                ((Compiler *)this,(uint32_t)local_58,&local_f4.id,&local_dc.id);
                      p_Var20 = local_40;
                      local_dc.id = local_10c.id;
                      pmVar35 = ::std::__detail::
                                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[](local_40,&local_dc);
                      pDVar4 = (pmVar35->members).super_VectorView<spirv_cross::Meta::Decoration>.
                               ptr;
                      local_70 = (uint32_t *)((uVar51 & 0xffffffff) * 0x188);
                      pmVar35 = (mapped_type *)(pDVar4 + (uVar51 & 0xffffffff));
                      local_5c.id = uVar25;
                      pmVar36 = ::std::__detail::
                                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[](p_Var20,&local_5c);
                      ::std::__cxx11::string::_M_assign((string *)pmVar36);
                      puVar30 = local_70;
                      ::std::__cxx11::string::_M_assign
                                ((string *)&(pmVar36->decoration).qualified_alias);
                      ::std::__cxx11::string::_M_assign
                                ((string *)&(pmVar36->decoration).hlsl_semantic);
                      ::std::__cxx11::string::_M_assign((string *)&(pmVar36->decoration).user_type);
                      (pmVar36->decoration).decoration_flags.lower =
                           *(uint64_t *)((long)puVar30 + (long)&pDVar4->decoration_flags);
                      if (pmVar35 == pmVar36) {
                        BVar14 = (pmVar35->decoration).builtin_type;
                        uVar15 = (pmVar35->decoration).location;
                        uVar16 = (pmVar35->decoration).component;
                        uVar17 = (pmVar35->decoration).set;
                        uVar10 = (pmVar35->decoration).binding;
                        uVar11 = (pmVar35->decoration).offset;
                        uVar12 = (pmVar35->decoration).xfb_buffer;
                        uVar13 = (pmVar35->decoration).xfb_stride;
                        uVar25 = (pmVar35->decoration).stream;
                        uVar7 = (pmVar35->decoration).array_stride;
                        uVar8 = (pmVar35->decoration).matrix_stride;
                        uVar9 = (pmVar35->decoration).input_attachment;
                        uVar6 = *(undefined8 *)((long)&(pmVar35->decoration).index + 2);
                        *(undefined8 *)((long)&(pmVar36->decoration).input_attachment + 2) =
                             *(undefined8 *)((long)&(pmVar35->decoration).input_attachment + 2);
                        *(undefined8 *)((long)&(pmVar36->decoration).index + 2) = uVar6;
                        (pmVar36->decoration).stream = uVar25;
                        (pmVar36->decoration).array_stride = uVar7;
                        (pmVar36->decoration).matrix_stride = uVar8;
                        (pmVar36->decoration).input_attachment = uVar9;
                        (pmVar36->decoration).binding = uVar10;
                        (pmVar36->decoration).offset = uVar11;
                        (pmVar36->decoration).xfb_buffer = uVar12;
                        (pmVar36->decoration).xfb_stride = uVar13;
                        (pmVar36->decoration).builtin_type = BVar14;
                        (pmVar36->decoration).location = uVar15;
                        (pmVar36->decoration).component = uVar16;
                        (pmVar36->decoration).set = uVar17;
                        (pmVar36->decoration).extended.flags.lower =
                             (pmVar35->decoration).extended.flags.lower;
                      }
                      else {
                        ::std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)&(pmVar36->decoration).decoration_flags.higher,
                                   &(pmVar35->decoration).decoration_flags.higher._M_h);
                        BVar14 = (pmVar35->decoration).builtin_type;
                        uVar15 = (pmVar35->decoration).location;
                        uVar16 = (pmVar35->decoration).component;
                        uVar17 = (pmVar35->decoration).set;
                        uVar10 = (pmVar35->decoration).binding;
                        uVar11 = (pmVar35->decoration).offset;
                        uVar12 = (pmVar35->decoration).xfb_buffer;
                        uVar13 = (pmVar35->decoration).xfb_stride;
                        uVar25 = (pmVar35->decoration).stream;
                        uVar7 = (pmVar35->decoration).array_stride;
                        uVar8 = (pmVar35->decoration).matrix_stride;
                        uVar9 = (pmVar35->decoration).input_attachment;
                        uVar6 = *(undefined8 *)((long)&(pmVar35->decoration).index + 2);
                        *(undefined8 *)((long)&(pmVar36->decoration).input_attachment + 2) =
                             *(undefined8 *)((long)&(pmVar35->decoration).input_attachment + 2);
                        *(undefined8 *)((long)&(pmVar36->decoration).index + 2) = uVar6;
                        (pmVar36->decoration).stream = uVar25;
                        (pmVar36->decoration).array_stride = uVar7;
                        (pmVar36->decoration).matrix_stride = uVar8;
                        (pmVar36->decoration).input_attachment = uVar9;
                        (pmVar36->decoration).binding = uVar10;
                        (pmVar36->decoration).offset = uVar11;
                        (pmVar36->decoration).xfb_buffer = uVar12;
                        (pmVar36->decoration).xfb_stride = uVar13;
                        (pmVar36->decoration).builtin_type = BVar14;
                        (pmVar36->decoration).location = uVar15;
                        (pmVar36->decoration).component = uVar16;
                        (pmVar36->decoration).set = uVar17;
                        (pmVar36->decoration).extended.flags.lower =
                             (pmVar35->decoration).extended.flags.lower;
                        ::std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)&(pmVar36->decoration).extended.flags.higher,
                                   &(pmVar35->decoration).extended.flags.higher._M_h);
                      }
                      puVar44 = (pmVar35->decoration).extended.values;
                      puVar45 = (pmVar36->decoration).extended.values;
                      for (lVar40 = 9; pSVar37 = local_108, puVar30 = local_100, pSVar47 = local_e8,
                          puVar49 = local_68, lVar40 != 0; lVar40 = lVar40 + -1) {
                        *(undefined8 *)puVar45 = *(undefined8 *)puVar44;
                        puVar44 = puVar44 + (ulong)bVar52 * -4 + 2;
                        puVar45 = puVar45 + (ulong)bVar52 * -4 + 2;
                      }
                    }
                  }
                  uVar51 = uVar51 + 1;
                  puVar49 = puVar49 + -1;
                } while (puVar49 != (uint32_t *)0x0);
              }
            }
            else {
              uVar25 = ParsedIR::increase_bound_by(local_88,1);
              p_Var19 = local_c0._M_h._M_single_bucket;
              TVar18.id = local_10c.id;
              SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                        ((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                         local_c0._M_h._M_rehash_policy._M_next_resize,
                         (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                          ((long)local_c0._M_h._M_single_bucket + 0x18))->
                         super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size + 1);
              pPVar5 = (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                        ((long)p_Var19 + 0x18))->
                       super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr;
              sVar3 = (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                       ((long)p_Var19 + 0x18))->
                      super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size;
              pPVar5[sVar3].type.id = TVar18.id;
              pPVar5[sVar3].id.id = uVar25;
              pPVar5[sVar3].read_count = 0;
              pPVar5[sVar3].write_count = 0;
              pPVar5[sVar3].alias_global_variable = true;
              (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)((long)p_Var19 + 0x18))->
              super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size = sVar3 + 1;
              local_d0._0_4_ = BuiltInPrimitiveId;
              local_f4.id = 0;
              Compiler::
              set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                        ((Compiler *)this,uVar25,&local_10c.id,(StorageClass *)local_d0,
                         (int *)&local_f4,&local_110.id);
              p_Var20 = local_40;
              local_d0._0_4_ = local_110.id;
              pmVar35 = ::std::__detail::
                        _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](local_40,(key_type *)local_d0);
              local_f4.id = uVar25;
              pmVar36 = ::std::__detail::
                        _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var20,&local_f4);
              Meta::operator=(pmVar36,pmVar35);
              puVar30 = local_100;
              pSVar47 = local_e8;
            }
          }
          else {
            if (!(bool)(bVar22 & bVar23)) goto LAB_0027e6be;
LAB_0027e665:
            local_d0._0_8_ = &local_c0;
            local_d0._8_8_ = 0;
            local_c0._M_h._M_buckets =
                 (__buckets_ptr)((ulong)local_c0._M_h._M_buckets & 0xffffffffffffff00);
            if ((char)local_f0 == '\0') {
              pcVar41 = "gl_out";
              if (pSVar37->storage == Input) {
                pcVar41 = "gl_in";
              }
              ::std::__cxx11::string::_M_replace((ulong)local_d0,0,(char *)0x0,(ulong)pcVar41);
            }
            else {
              ::std::__cxx11::string::_M_assign((string *)local_d0);
            }
            puVar30 = local_100;
            SVar26 = pSVar37->storage;
            if (SVar26 == Output) {
              bVar22 = Compiler::has_decoration((Compiler *)this,(ID)pIVar48->id,Block);
              if ((bVar22) &&
                 ((int)(type->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size !=
                  0)) {
                uVar25 = 0;
                do {
                  bVar22 = CompilerGLSL::is_stage_output_block_member_masked
                                     (&this->super_CompilerGLSL,local_108,uVar25,true);
                  p_Var19 = local_c0._M_h._M_single_bucket;
                  if (bVar22) {
                    local_58 = *(_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 **)&(local_108->super_IVariant).self;
                    uStack_50 = 0;
                    SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                              ((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                               local_c0._M_h._M_rehash_policy._M_next_resize,
                               (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                                ((long)local_c0._M_h._M_single_bucket + 0x18))->
                               super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size +
                               1);
                    pPVar5 = (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                              ((long)p_Var19 + 0x18))->
                             super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr;
                    sVar3 = (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                             ((long)p_Var19 + 0x18))->
                            super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size;
                    pPVar5[sVar3].type = (TypeID)local_58._4_4_;
                    pPVar5[sVar3].id = (ID)(uint32_t)local_58;
                    pPVar5[sVar3].read_count = 0;
                    pPVar5[sVar3].write_count = 0;
                    pPVar5[sVar3].alias_global_variable = true;
                    (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                     ((long)p_Var19 + 0x18))->super_VectorView<spirv_cross::SPIRFunction::Parameter>
                    ).buffer_size = sVar3 + 1;
                    break;
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 < (uint)(type->member_types).
                                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                        .buffer_size);
              }
              SVar26 = local_108->storage;
            }
            bVar42 = (byte)local_f0;
            pSVar47 = local_e8;
            puVar49 = local_d8;
            if (SVar26 == Input) {
              bVar39 = (byte)local_d8;
              if (bVar42 != 0) {
                bVar39 = (byte)local_80;
              }
              if ((bVar39 & 1) == 0) {
                local_110.id = this->next_metal_resource_ids[(ulong)(bVar42 ^ 1) * 2 + 10];
                local_80 = (SPIRType *)
                           CONCAT71((int7)((ulong)local_80 >> 8),(byte)local_80 | bVar42);
                local_d8 = (uint32_t *)(ulong)(byte)(bVar42 ^ 1 | (byte)local_d8);
                goto LAB_0027ec96;
              }
            }
            else {
              if (SVar26 == Output) {
                bVar39 = (byte)puVar30;
                if (bVar42 != 0) {
                  bVar39 = (byte)local_e8;
                }
                if ((bVar39 & 1) != 0) goto LAB_0027ed8e;
                local_110.id = this->next_metal_resource_ids[(ulong)(bVar42 ^ 1) * 2 + 0xb];
                local_e8 = (SPIRBlock *)
                           CONCAT71((int7)((ulong)local_e8 >> 8),(byte)local_e8 | bVar42);
                puVar30 = (uint32_t *)(ulong)(byte)(bVar42 ^ 1 | (byte)puVar30);
              }
LAB_0027ec96:
              pSVar37 = Variant::get<spirv_cross::SPIRVariable>
                                  ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr + local_110.id);
              local_10c.id = *(uint32_t *)&(pSVar37->super_IVariant).field_0xc;
              id.id = ParsedIR::increase_bound_by(local_88,1);
              p_Var19 = local_c0._M_h._M_single_bucket;
              pSVar47 = local_e8;
              local_100 = (uint32_t *)CONCAT44(local_100._4_4_,local_10c.id);
              SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                        ((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                         local_c0._M_h._M_rehash_policy._M_next_resize,
                         (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                          ((long)local_c0._M_h._M_single_bucket + 0x18))->
                         super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size + 1);
              pPVar5 = (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                        ((long)p_Var19 + 0x18))->
                       super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr;
              sVar3 = (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                       ((long)p_Var19 + 0x18))->
                      super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size;
              pPVar5[sVar3].type.id = (uint32_t)local_100;
              pPVar5[sVar3].id.id = id.id;
              pPVar5[sVar3].read_count = 0;
              pPVar5[sVar3].write_count = 0;
              pPVar5[sVar3].alias_global_variable = true;
              (((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)((long)p_Var19 + 0x18))->
              super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size = sVar3 + 1;
              local_f4.id = 7;
              local_dc.id = 0;
              Compiler::
              set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                        ((Compiler *)this,id.id,&local_10c.id,&local_f4.id,(int *)&local_dc,
                         &local_110.id);
              Compiler::set_name((Compiler *)this,id,(string *)local_d0);
              puVar49 = local_d8;
              EVar27 = Compiler::get_execution_model((Compiler *)this);
              if (((EVar27 == ExecutionModelTessellationEvaluation) &&
                  ((this->msl_options).raw_buffer_tese_input == true)) &&
                 (local_108->storage == Input)) {
                Compiler::set_decoration((Compiler *)this,id,DecorationNonWritable,0);
              }
            }
LAB_0027ed8e:
            local_d8 = puVar49;
            if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_d0._0_8_ != &local_c0) {
              operator_delete((void *)local_d0._0_8_);
            }
          }
          local_78 = (_Base_ptr)::std::_Rb_tree_increment(local_78);
          pSVar34 = local_80;
        } while ((_Rb_tree_header *)local_78 != p_Var50);
      }
    }
  }
  else {
    p_Var29 = &::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->function_global_vars,
                            (key_type *)&local_c0._M_h._M_rehash_policy.field_0x4)->_M_t;
    ::std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(&added_arg_ids->_M_t,p_Var29);
  }
  return;
}

Assistant:

void CompilerMSL::extract_global_variables_from_function(uint32_t func_id, std::set<uint32_t> &added_arg_ids,
                                                         unordered_set<uint32_t> &global_var_ids,
                                                         unordered_set<uint32_t> &processed_func_ids)
{
	// Avoid processing a function more than once
	if (processed_func_ids.find(func_id) != processed_func_ids.end())
	{
		// Return function global variables
		added_arg_ids = function_global_vars[func_id];
		return;
	}

	processed_func_ids.insert(func_id);

	auto &func = get<SPIRFunction>(func_id);

	// Recursively establish global args added to functions on which we depend.
	for (auto block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			switch (op)
			{
			case OpLoad:
			case OpInBoundsAccessChain:
			case OpAccessChain:
			case OpPtrAccessChain:
			case OpArrayLength:
			{
				uint32_t base_id = ops[2];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);

				// Use Metal's native frame-buffer fetch API for subpass inputs.
				auto &type = get<SPIRType>(ops[0]);
				if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData &&
				    (!msl_options.use_framebuffer_fetch_subpasses))
				{
					// Implicitly reads gl_FragCoord.
					assert(builtin_frag_coord_id != 0);
					added_arg_ids.insert(builtin_frag_coord_id);
					if (msl_options.multiview)
					{
						// Implicitly reads gl_ViewIndex.
						assert(builtin_view_idx_id != 0);
						added_arg_ids.insert(builtin_view_idx_id);
					}
					else if (msl_options.arrayed_subpass_input)
					{
						// Implicitly reads gl_Layer.
						assert(builtin_layer_id != 0);
						added_arg_ids.insert(builtin_layer_id);
					}
				}

				break;
			}

			case OpFunctionCall:
			{
				// First see if any of the function call args are globals
				for (uint32_t arg_idx = 3; arg_idx < i.length; arg_idx++)
				{
					uint32_t arg_id = ops[arg_idx];
					if (global_var_ids.find(arg_id) != global_var_ids.end())
						added_arg_ids.insert(arg_id);
				}

				// Then recurse into the function itself to extract globals used internally in the function
				uint32_t inner_func_id = ops[2];
				std::set<uint32_t> inner_func_args;
				extract_global_variables_from_function(inner_func_id, inner_func_args, global_var_ids,
				                                       processed_func_ids);
				added_arg_ids.insert(inner_func_args.begin(), inner_func_args.end());
				break;
			}

			case OpStore:
			{
				uint32_t base_id = ops[0];
				if (global_var_ids.find(base_id) != global_var_ids.end())
				{
					added_arg_ids.insert(base_id);

					if (msl_options.input_attachment_is_ds_attachment && base_id == builtin_frag_depth_id)
						writes_to_depth = true;
				}

				uint32_t rvalue_id = ops[1];
				if (global_var_ids.find(rvalue_id) != global_var_ids.end())
					added_arg_ids.insert(rvalue_id);

				if (needs_frag_discard_checks())
					added_arg_ids.insert(builtin_helper_invocation_id);

				break;
			}

			case OpSelect:
			{
				uint32_t base_id = ops[3];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				base_id = ops[4];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			case OpAtomicExchange:
			case OpAtomicCompareExchange:
			case OpAtomicStore:
			case OpAtomicIIncrement:
			case OpAtomicIDecrement:
			case OpAtomicIAdd:
			case OpAtomicFAddEXT:
			case OpAtomicISub:
			case OpAtomicSMin:
			case OpAtomicUMin:
			case OpAtomicSMax:
			case OpAtomicUMax:
			case OpAtomicAnd:
			case OpAtomicOr:
			case OpAtomicXor:
			case OpImageWrite:
			{
				if (needs_frag_discard_checks())
					added_arg_ids.insert(builtin_helper_invocation_id);
				uint32_t ptr = 0;
				if (op == OpAtomicStore || op == OpImageWrite)
					ptr = ops[0];
				else
					ptr = ops[2];
				if (global_var_ids.find(ptr) != global_var_ids.end())
					added_arg_ids.insert(ptr);
				break;
			}

			// Emulate texture2D atomic operations
			case OpImageTexelPointer:
			{
				// When using the pointer, we need to know which variable it is actually loaded from.
				uint32_t base_id = ops[2];
				auto *var = maybe_get_backing_variable(base_id);
				if (var)
				{
					if (atomic_image_vars_emulated.count(var->self) &&
					    !get<SPIRType>(var->basetype).array.empty())
					{
						SPIRV_CROSS_THROW(
								"Cannot emulate array of storage images with atomics. Use MSL 3.1 for native support.");
					}

					if (global_var_ids.find(base_id) != global_var_ids.end())
						added_arg_ids.insert(base_id);
				}
				break;
			}

			case OpExtInst:
			{
				uint32_t extension_set = ops[2];
				if (get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
				{
					auto op_450 = static_cast<GLSLstd450>(ops[3]);
					switch (op_450)
					{
					case GLSLstd450InterpolateAtCentroid:
					case GLSLstd450InterpolateAtSample:
					case GLSLstd450InterpolateAtOffset:
					{
						// For these, we really need the stage-in block. It is theoretically possible to pass the
						// interpolant object, but a) doing so would require us to create an entirely new variable
						// with Interpolant type, and b) if we have a struct or array, handling all the members and
						// elements could get unwieldy fast.
						added_arg_ids.insert(stage_in_var_id);
						break;
					}

					case GLSLstd450Modf:
					case GLSLstd450Frexp:
					{
						uint32_t base_id = ops[5];
						if (global_var_ids.find(base_id) != global_var_ids.end())
							added_arg_ids.insert(base_id);
						break;
					}

					default:
						break;
					}
				}
				break;
			}

			case OpGroupNonUniformInverseBallot:
			{
				added_arg_ids.insert(builtin_subgroup_invocation_id_id);
				break;
			}

			case OpGroupNonUniformBallotFindLSB:
			case OpGroupNonUniformBallotFindMSB:
			{
				added_arg_ids.insert(builtin_subgroup_size_id);
				break;
			}

			case OpGroupNonUniformBallotBitCount:
			{
				auto operation = static_cast<GroupOperation>(ops[3]);
				switch (operation)
				{
				case GroupOperationReduce:
					added_arg_ids.insert(builtin_subgroup_size_id);
					break;
				case GroupOperationInclusiveScan:
				case GroupOperationExclusiveScan:
					added_arg_ids.insert(builtin_subgroup_invocation_id_id);
					break;
				default:
					break;
				}
				break;
			}

			case OpDemoteToHelperInvocation:
				if (needs_manual_helper_invocation_updates() && needs_helper_invocation)
					added_arg_ids.insert(builtin_helper_invocation_id);
				break;

			case OpIsHelperInvocationEXT:
				if (needs_manual_helper_invocation_updates())
					added_arg_ids.insert(builtin_helper_invocation_id);
				break;

			case OpRayQueryInitializeKHR:
			case OpRayQueryProceedKHR:
			case OpRayQueryTerminateKHR:
			case OpRayQueryGenerateIntersectionKHR:
			case OpRayQueryConfirmIntersectionKHR:
			{
				// Ray query accesses memory directly, need check pass down object if using Private storage class.
				uint32_t base_id = ops[0];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			case OpRayQueryGetRayTMinKHR:
			case OpRayQueryGetRayFlagsKHR:
			case OpRayQueryGetWorldRayOriginKHR:
			case OpRayQueryGetWorldRayDirectionKHR:
			case OpRayQueryGetIntersectionCandidateAABBOpaqueKHR:
			case OpRayQueryGetIntersectionTypeKHR:
			case OpRayQueryGetIntersectionTKHR:
			case OpRayQueryGetIntersectionInstanceCustomIndexKHR:
			case OpRayQueryGetIntersectionInstanceIdKHR:
			case OpRayQueryGetIntersectionInstanceShaderBindingTableRecordOffsetKHR:
			case OpRayQueryGetIntersectionGeometryIndexKHR:
			case OpRayQueryGetIntersectionPrimitiveIndexKHR:
			case OpRayQueryGetIntersectionBarycentricsKHR:
			case OpRayQueryGetIntersectionFrontFaceKHR:
			case OpRayQueryGetIntersectionObjectRayDirectionKHR:
			case OpRayQueryGetIntersectionObjectRayOriginKHR:
			case OpRayQueryGetIntersectionObjectToWorldKHR:
			case OpRayQueryGetIntersectionWorldToObjectKHR:
			{
				// Ray query accesses memory directly, need check pass down object if using Private storage class.
				uint32_t base_id = ops[2];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			default:
				break;
			}

			if (needs_manual_helper_invocation_updates() && b.terminator == SPIRBlock::Kill &&
			    needs_helper_invocation)
				added_arg_ids.insert(builtin_helper_invocation_id);

			// TODO: Add all other operations which can affect memory.
			// We should consider a more unified system here to reduce boiler-plate.
			// This kind of analysis is done in several places ...
		}
	}

	function_global_vars[func_id] = added_arg_ids;

	// Add the global variables as arguments to the function
	if (func_id != ir.default_entry_point)
	{
		bool control_point_added_in = false;
		bool control_point_added_out = false;
		bool patch_added_in = false;
		bool patch_added_out = false;

		for (uint32_t arg_id : added_arg_ids)
		{
			auto &var = get<SPIRVariable>(arg_id);
			uint32_t type_id = var.basetype;
			auto *p_type = &get<SPIRType>(type_id);
			BuiltIn bi_type = BuiltIn(get_decoration(arg_id, DecorationBuiltIn));

			bool is_patch = has_decoration(arg_id, DecorationPatch) || is_patch_block(*p_type);
			bool is_block = has_decoration(p_type->self, DecorationBlock);
			bool is_control_point_storage =
			    !is_patch && ((is_tessellation_shader() && var.storage == StorageClassInput) ||
			                  (is_tesc_shader() && var.storage == StorageClassOutput));
			bool is_patch_block_storage = is_patch && is_block && var.storage == StorageClassOutput;
			bool is_builtin = is_builtin_variable(var);
			bool variable_is_stage_io =
					!is_builtin || bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
					bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance ||
					p_type->basetype == SPIRType::Struct;
			bool is_redirected_to_global_stage_io = (is_control_point_storage || is_patch_block_storage) &&
			                                        variable_is_stage_io;

			// If output is masked it is not considered part of the global stage IO interface.
			if (is_redirected_to_global_stage_io && var.storage == StorageClassOutput)
				is_redirected_to_global_stage_io = !is_stage_output_variable_masked(var);

			if (is_redirected_to_global_stage_io)
			{
				// Tessellation control shaders see inputs and per-point outputs as arrays.
				// Similarly, tessellation evaluation shaders see per-point inputs as arrays.
				// We collected them into a structure; we must pass the array of this
				// structure to the function.
				std::string name;
				if (is_patch)
					name = var.storage == StorageClassInput ? patch_stage_in_var_name : patch_stage_out_var_name;
				else
					name = var.storage == StorageClassInput ? "gl_in" : "gl_out";

				if (var.storage == StorageClassOutput && has_decoration(p_type->self, DecorationBlock))
				{
					// If we're redirecting a block, we might still need to access the original block
					// variable if we're masking some members.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(p_type->member_types.size()); mbr_idx++)
					{
						if (is_stage_output_block_member_masked(var, mbr_idx, true))
						{
							func.add_parameter(var.basetype, var.self, true);
							break;
						}
					}
				}

				if (var.storage == StorageClassInput)
				{
					auto &added_in = is_patch ? patch_added_in : control_point_added_in;
					if (added_in)
						continue;
					arg_id = is_patch ? patch_stage_in_var_id : stage_in_ptr_var_id;
					added_in = true;
				}
				else if (var.storage == StorageClassOutput)
				{
					auto &added_out = is_patch ? patch_added_out : control_point_added_out;
					if (added_out)
						continue;
					arg_id = is_patch ? patch_stage_out_var_id : stage_out_ptr_var_id;
					added_out = true;
				}

				type_id = get<SPIRVariable>(arg_id).basetype;
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				set_name(next_id, name);
				if (is_tese_shader() && msl_options.raw_buffer_tese_input && var.storage == StorageClassInput)
					set_decoration(next_id, DecorationNonWritable);
			}
			else if (is_builtin && has_decoration(p_type->self, DecorationBlock))
			{
				// Get the pointee type
				type_id = get_pointee_type_id(type_id);
				p_type = &get<SPIRType>(type_id);

				uint32_t mbr_idx = 0;
				for (auto &mbr_type_id : p_type->member_types)
				{
					BuiltIn builtin = BuiltInMax;
					is_builtin = is_member_builtin(*p_type, mbr_idx, &builtin);
					if (is_builtin && has_active_builtin(builtin, var.storage))
					{
						// Add a arg variable with the same type and decorations as the member
						uint32_t next_ids = ir.increase_bound_by(2);
						uint32_t ptr_type_id = next_ids + 0;
						uint32_t var_id = next_ids + 1;

						// Make sure we have an actual pointer type,
						// so that we will get the appropriate address space when declaring these builtins.
						auto &ptr = set<SPIRType>(ptr_type_id, get<SPIRType>(mbr_type_id));
						ptr.self = mbr_type_id;
						ptr.storage = var.storage;
						ptr.pointer = true;
						ptr.pointer_depth++;
						ptr.parent_type = mbr_type_id;

						func.add_parameter(mbr_type_id, var_id, true);
						set<SPIRVariable>(var_id, ptr_type_id, StorageClassFunction);
						ir.meta[var_id].decoration = ir.meta[type_id].members[mbr_idx];
					}
					mbr_idx++;
				}
			}
			else
			{
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				// Ensure the new variable has all the same meta info
				ir.meta[next_id] = ir.meta[arg_id];
			}
		}
	}
}